

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

ScalarFunctionSet *
duckdb::GetIntegralCompressFunctionSet
          (ScalarFunctionSet *__return_storage_ptr__,LogicalType *result_type)

{
  idx_t iVar1;
  idx_t iVar2;
  LogicalType *in_RDX;
  pointer input_type;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_190;
  string local_178;
  ScalarFunction local_158;
  
  IntegralCompressFunctionName_abi_cxx11_(&local_178,(duckdb *)result_type,in_RDX);
  ScalarFunctionSet::ScalarFunctionSet(__return_storage_ptr__,&local_178);
  ::std::__cxx11::string::~string((string *)&local_178);
  LogicalType::Integral();
  for (input_type = local_190.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      input_type !=
      local_190.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish; input_type = input_type + 1) {
    iVar1 = GetTypeIdSize(result_type->physical_type_);
    iVar2 = GetTypeIdSize(input_type->physical_type_);
    if (iVar1 < iVar2) {
      CMIntegralCompressFun::GetFunction(&local_158,input_type,result_type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&(__return_storage_ptr__->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      ScalarFunction::~ScalarFunction(&local_158);
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_190);
  return __return_storage_ptr__;
}

Assistant:

static ScalarFunctionSet GetIntegralCompressFunctionSet(const LogicalType &result_type) {
	ScalarFunctionSet set(IntegralCompressFunctionName(result_type));
	for (const auto &input_type : LogicalType::Integral()) {
		if (GetTypeIdSize(result_type.InternalType()) < GetTypeIdSize(input_type.InternalType())) {
			set.AddFunction(CMIntegralCompressFun::GetFunction(input_type, result_type));
		}
	}
	return set;
}